

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::Emit
          (RustSymbolParser *this,char *token)

{
  ulong __n;
  size_t sVar1;
  bool bVar2;
  
  if (0 < this->silence_depth_) {
    return true;
  }
  sVar1 = strlen(token);
  __n = sVar1 + 1;
  bVar2 = __n <= (ulong)((long)this->out_end_ - (long)this->out_);
  if (bVar2) {
    memcpy(this->out_,token,__n);
    this->out_ = this->out_ + sVar1;
  }
  return bVar2;
}

Assistant:

ABSL_MUST_USE_RESULT bool Emit(const char* token) {
    if (silence_depth_ > 0) return true;
    const size_t token_length = std::strlen(token);
    const size_t bytes_to_copy = token_length + 1;  // token and final NUL
    if (static_cast<size_t>(out_end_ - out_) < bytes_to_copy) return false;
    std::memcpy(out_, token, bytes_to_copy);
    out_ += token_length;
    return true;
  }